

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.hpp
# Opt level: O0

access_to_missing_argument * __thiscall
boost::runtime::
specific_param_error<boost::runtime::access_to_missing_argument,_boost::runtime::init_error>::
operator<<(specific_param_error<boost::runtime::access_to_missing_argument,_boost::runtime::init_error>
           *this,char *val)

{
  long in_RSI;
  access_to_missing_argument *in_RDI;
  access_to_missing_argument *in_stack_ffffffffffffffc8;
  access_to_missing_argument *this_00;
  
  this_00 = in_RDI;
  std::__cxx11::string::append((char *)(in_RSI + 0x18));
  access_to_missing_argument::access_to_missing_argument(this_00,in_stack_ffffffffffffffc8);
  return in_RDI;
}

Assistant:

Derived operator<<(char const* val) &&
    {
        this->msg.append( val );

        return reinterpret_cast<Derived&&>(*this);
    }